

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_color_generic_rgb64(int count,QT_FT_Span *spans,void *userData)

{
  BPP BVar1;
  bool bVar2;
  int iVar3;
  int priority;
  QThreadPool *pQVar4;
  ulong uVar5;
  QSpanData *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  byte bVar6;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  BPP bpp;
  bool solidFill;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_40_6_31ab0bab function;
  QRgba64 color;
  Operator op;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  int iVar7;
  undefined4 in_stack_fffffffffffffe8c;
  int iVar8;
  QMessageLogger *in_stack_fffffffffffffe90;
  QThreadPool *this;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  QSpanData *data_00;
  undefined1 *local_120;
  int *local_118 [2];
  byte local_108;
  BPP local_104;
  quint64 local_f8;
  undefined1 *local_f0;
  char local_e8 [32];
  int local_c8 [18];
  long local_80;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data_00 = in_RDX;
  memcpy(local_c8,&DAT_00bfe2d8,0xb0);
  getOperator(data_00,(QT_FT_Span *)in_RDX,in_stack_fffffffffffffea4);
  if (local_80 == 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiDrawHelper();
    anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    while( true ) {
      bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar2) break;
      anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb46e57);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe90,
                 (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe84,(char *)in_stack_fffffffffffffe78,(char *)0xb46e70);
      QMessageLogger::debug
                (local_e8,
                 "blend_color_generic_rgb64: unsupported 64bit blend attempted, falling back to 32-bit"
                );
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    blend_color_generic((int)((ulong)in_RSI >> 0x20),(QT_FT_Span *)data_00,in_RDX);
  }
  else {
    local_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_f0 = (undefined1 *)
               QColor::rgba64((QColor *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    bVar6 = local_c8[0] == 3;
    BVar1 = qPixelLayouts[in_RDX->rasterBuffer->format].bpp;
    memset(local_118,0xaa,0x28);
    local_118[0] = local_c8;
    local_108 = bVar6 & 1;
    local_f8 = (quint64)local_f0;
    iVar3 = (in_EDI + 0x20) / 0x40;
    local_104 = BVar1;
    pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
    this = pQVar4;
    if (((1 < iVar3) && (2 < (int)qPixelLayouts[in_RDX->rasterBuffer->format].bpp)) &&
       (pQVar4 != (QThreadPool *)0x0)) {
      QThread::currentThread();
      uVar5 = QThreadPool::contains((QThread *)pQVar4);
      if ((uVar5 & 1) == 0) {
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)&local_120,0);
        iVar8 = 0;
        for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
          priority = (in_EDI - iVar8) / (iVar3 - iVar7);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4099:5),_true>
                    (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar8,iVar7),priority);
          iVar8 = priority + iVar8;
        }
        QSemaphore::acquire((int)&local_120);
        QSemaphore::~QSemaphore((QSemaphore *)&local_120);
        goto LAB_00b470a2;
      }
    }
    blend_color_generic_rgb64::anon_class_40_6_31ab0bab::operator()
              ((anon_class_40_6_31ab0bab *)CONCAT44(iVar3,in_stack_fffffffffffffe98),
               (int)((ulong)this >> 0x20),(int)this);
  }
LAB_00b470a2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic_rgb64(int count, const QT_FT_Span *spans, void *userData)
{
#if QT_CONFIG(raster_64bit)
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    if (!op.funcSolid64) {
        qCDebug(lcQtGuiDrawHelper, "blend_color_generic_rgb64: unsupported 64bit blend attempted, falling back to 32-bit");
        return blend_color_generic(count, spans, userData);
    }

    const QRgba64 color = data->solidColor.rgba64();
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    const QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStore64) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStore64(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                QRgba64 *dest = op.destFetch64(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolid64(dest, l, color, spans[c].coverage);
                if (op.destStore64)
                    op.destStore64(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
#else
    blend_color_generic(count, spans, userData);
#endif
}